

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_fm.hpp
# Opt level: O1

ssize_t __thiscall
ymfm::fm_engine_base<ymfm::opn_registers_base<false>_>::write
          (fm_engine_base<ymfm::opn_registers_base<false>_> *this,int __fd,void *__buf,size_t __n)

{
  long lVar1;
  undefined8 in_RAX;
  ssize_t sVar2;
  _Head_base<0UL,_ymfm::fm_channel<ymfm::opn_registers_base<false>_>_*,_false> _Var3;
  long lVar4;
  uint32_t keyon_opmask;
  uint32_t keyon_channel;
  undefined8 local_18;
  
  if (__fd == 0x27) {
    sVar2 = (*(code *)this->m_intf->m_engine->_vptr_ymfm_engine_callbacks)
                      (this->m_intf,(ulong)__buf & 0xff);
    return sVar2;
  }
  this->m_modified_channels = 7;
  local_18 = in_RAX;
  _Var3._M_head_impl =
       (fm_channel<ymfm::opn_registers_base<false>_> *)
       opn_registers_base<false>::write
                 (&this->m_regs,__fd & 0xffff,(void *)((ulong)__buf & 0xff),(long)&local_18 + 4);
  if ((local_18._4_4_ < 3 & (byte)_Var3._M_head_impl) == 1) {
    _Var3._M_head_impl =
         this->m_channel[local_18._4_4_]._M_t.
         super___uniq_ptr_impl<ymfm::fm_channel<ymfm::opn_registers_base<false>_>,_std::default_delete<ymfm::fm_channel<ymfm::opn_registers_base<false>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_ymfm::fm_channel<ymfm::opn_registers_base<false>_>_*,_std::default_delete<ymfm::fm_channel<ymfm::opn_registers_base<false>_>_>_>
         .super__Head_base<0UL,_ymfm::fm_channel<ymfm::opn_registers_base<false>_>_*,_false>.
         _M_head_impl;
    lVar4 = 0;
    do {
      lVar1 = *(long *)((long)_Var3._M_head_impl + 0x10 + lVar4 * 8);
      if (lVar1 != 0) {
        *(byte *)(lVar1 + 0x16) =
             ((uint)local_18 >> ((uint)lVar4 & 0x1f) & 1) != 0 | *(byte *)(lVar1 + 0x16) & 0xfe;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 4);
  }
  return (ssize_t)_Var3._M_head_impl;
}

Assistant:

void fm_engine_base<RegisterType>::write(uint16_t regnum, uint8_t data)
{
	debug::log_fm_write("%03X = %02X\n", regnum, data);

	// special case: writes to the mode register can impact IRQs;
	// schedule these writes to ensure ordering with timers
	if (regnum == RegisterType::REG_MODE)
	{
		m_intf.ymfm_sync_mode_write(data);
		return;
	}

	// for now just mark all channels as modified
	m_modified_channels = ALL_CHANNELS;

	// most writes are passive, consumed only when needed
	uint32_t keyon_channel;
	uint32_t keyon_opmask;
	if (m_regs.write(regnum, data, keyon_channel, keyon_opmask))
	{
		// handle writes to the keyon register(s)
		if (keyon_channel < CHANNELS)
		{
			// normal channel on/off
			m_channel[keyon_channel]->keyonoff(keyon_opmask, KEYON_NORMAL, keyon_channel);
		}
		else if (CHANNELS >= 9 && keyon_channel == RegisterType::RHYTHM_CHANNEL)
		{
			// special case for the OPL rhythm channels
			m_channel[6]->keyonoff(bitfield(keyon_opmask, 4) ? 3 : 0, KEYON_RHYTHM, 6);
			m_channel[7]->keyonoff(bitfield(keyon_opmask, 0) | (bitfield(keyon_opmask, 3) << 1), KEYON_RHYTHM, 7);
			m_channel[8]->keyonoff(bitfield(keyon_opmask, 2) | (bitfield(keyon_opmask, 1) << 1), KEYON_RHYTHM, 8);
		}
	}
}